

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
::internal_emplace<phmap::priv::(anonymous_namespace)::InsertMultiHintData_const&>
          (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,256,true>>
           *this,iterator iter,InsertMultiHintData *args)

{
  InsertMultiHintData IVar1;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  bVar2;
  ulong uVar3;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *pbVar4;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  bVar5;
  byte bVar6;
  ulong uVar7;
  allocator_type *alloc;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *pbVar8;
  ulong uVar9;
  iterator iVar10;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_&,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_*>
  local_38;
  
  pbVar8 = iter.node;
  local_38.position = iter.position;
  local_38.node = pbVar8;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    if (pbVar8[0xb] ==
        (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
         )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_&,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_*>
      ::operator--(&local_38);
      local_38.position = local_38.position + 1;
    }
    if (((ulong)local_38.node & 7) == 0) {
      bVar2 = local_38.node[0xb];
      uVar7 = (ulong)(byte)bVar2;
      bVar5 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
               )0x1e;
      if (bVar2 != (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                    )0x0) {
        bVar5 = bVar2;
      }
      if (local_38.node[10] == bVar5) {
        if ((byte)bVar5 < 0x1e) {
          if (local_38.node !=
              *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                **)this) {
            __assert_fail("iter.node == root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xc27,
                          "iterator phmap::priv::btree<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>, Args = <const phmap::priv::(anonymous namespace)::InsertMultiHintData &>]"
                         );
          }
          bVar6 = 0x1e;
          if ((byte)((char)bVar5 * '\x02') < 0x1e) {
            bVar6 = (char)bVar5 * '\x02';
          }
          local_38.node =
               btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
               ::new_leaf_root_node
                         ((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                           *)(ulong)bVar6,(int)pbVar8);
          pbVar8 = *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                     **)this;
          btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::swap(local_38.node,pbVar8,alloc);
          btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::delete_leaf_node(*(btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                               **)this,pbVar8);
          *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
            **)this = local_38.node;
          *(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
            **)(this + 8) = local_38.node;
          uVar7 = extraout_RDX;
        }
        else {
          btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::rebalance_or_split
                    ((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                      *)this,&local_38);
          uVar7 = extraout_RDX_00;
        }
      }
      pbVar8 = local_38.node;
      if (((ulong)local_38.node & 7) == 0) {
        uVar9 = (ulong)local_38.position;
        uVar3 = (ulong)(byte)local_38.node[10];
        if (uVar9 <= uVar3) {
          for (; uVar9 < uVar3; uVar3 = uVar3 - 1) {
            *(undefined8 *)(local_38.node + uVar3 * 8 + 0xc) =
                 *(undefined8 *)(local_38.node + uVar3 * 8 + 4);
          }
          IVar1 = *args;
          *(InsertMultiHintData *)(local_38.node + uVar9 * 8 + 0xc) = IVar1;
          bVar2 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                   )((char)local_38.node[10] + 1);
          pbVar4 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                    *)CONCAT71(IVar1._1_7_,bVar2);
          local_38.node[10] = bVar2;
          if (local_38.node[0xb] ==
              (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
               )0x0) {
            uVar9 = uVar9 + 1;
            uVar3 = (ulong)(byte)bVar2;
            if (uVar9 < (byte)bVar2) {
              while ((int)uVar9 < (int)uVar3) {
                uVar7 = (ulong)((int)uVar3 - 1);
                pbVar4 = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                         ::child(pbVar8,uVar7);
                btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                ::set_child(pbVar8,uVar3,pbVar4);
                uVar3 = uVar7;
              }
              pbVar4 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                        *)btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                          ::mutable_child(pbVar8,uVar9);
              uVar7 = extraout_RDX_01;
            }
          }
          *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
          iVar10._8_8_ = uVar7;
          iVar10.node = pbVar4;
          return iVar10;
        }
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>, Args = <const phmap::priv::(anonymous namespace)::InsertMultiHintData &>]"
                     );
      }
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *, unsigned char, phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *, unsigned char, phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }